

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

void __thiscall
dlib::array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::push_back
          (array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *this,
          unsigned_long *item)

{
  size_t sVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t i;
  ulong uVar5;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> temp;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> local_58;
  
  sVar1 = this->max_array_size;
  iVar4 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])();
  if (sVar1 == CONCAT44(extraout_var,iVar4)) {
    local_58.super_enumerable<unsigned_long>._vptr_enumerable = (_func_int **)&PTR__array_001fab98;
    local_58.pool._vptr_memory_manager_stateless_kernel_1 =
         (_func_int **)&PTR__memory_manager_stateless_kernel_1_001fac18;
    local_58.array_size = 0;
    local_58.max_array_size = 0;
    local_58.array_elements = (unsigned_long *)0x0;
    local_58.pos = (unsigned_long *)0x0;
    local_58.last_pos = (unsigned_long *)0x0;
    local_58._at_start = true;
    iVar4 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
    set_max_size(&local_58,CONCAT44(extraout_var_00,iVar4) * 2 + 1);
    iVar4 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
    set_size(&local_58,CONCAT44(extraout_var_01,iVar4) + 1);
    uVar5 = 0;
    while( true ) {
      iVar4 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
      if (CONCAT44(extraout_var_02,iVar4) <= uVar5) break;
      uVar2 = this->array_elements[uVar5];
      this->array_elements[uVar5] = local_58.array_elements[uVar5];
      local_58.array_elements[uVar5] = uVar2;
      uVar5 = uVar5 + 1;
    }
    uVar2 = *item;
    *item = local_58.array_elements[local_58.array_size - 1];
    local_58.array_elements[local_58.array_size - 1] = uVar2;
    swap(&local_58,this);
    ~array(&local_58);
  }
  else {
    iVar4 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
    set_size(this,CONCAT44(extraout_var_03,iVar4) + 1);
    iVar4 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
    puVar3 = this->array_elements;
    uVar2 = *item;
    *item = puVar3[CONCAT44(extraout_var_04,iVar4) + -1];
    puVar3[CONCAT44(extraout_var_04,iVar4) + -1] = uVar2;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (size_t i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }